

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_feature_helper.h
# Opt level: O3

JavaFeatures * __thiscall
google::protobuf::internal::InternalFeatureHelper::
GetResolvedFeatureExtension<google::protobuf::FileDescriptor,pb::JavaFeatures,(unsigned_char)11,false>
          (JavaFeatures *__return_storage_ptr__,InternalFeatureHelper *this,
          FileDescriptor *descriptor,
          ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::JavaFeatures>,_(unsigned_char)__v_,_false>
          *extension)

{
  int number;
  int extension_number;
  int number_00;
  bool bVar1;
  Edition EVar2;
  JavaFeatures *pJVar3;
  Edition in_R8D;
  string_view data;
  JavaFeatures lang_features;
  JavaFeatures lang_features_ret;
  JavaFeatures JStack_b8;
  JavaFeatures local_90;
  undefined1 local_68 [80];
  
  number._0_1_ = descriptor->super_SymbolBase;
  number._1_1_ = descriptor->is_placeholder_;
  number._2_1_ = descriptor->finished_building_;
  number._3_1_ = descriptor->field_0x3;
  pJVar3 = (JavaFeatures *)
           ExtensionSet::GetMessage
                     ((ExtensionSet *)(*(long *)(this + 0x90) + 0x10),number,
                      (MessageLite *)descriptor->name_);
  pb::JavaFeatures::JavaFeatures(&JStack_b8,(Arena *)0x0,pJVar3);
  extension_number._0_1_ = descriptor->super_SymbolBase;
  extension_number._1_1_ = descriptor->is_placeholder_;
  extension_number._2_1_ = descriptor->finished_building_;
  extension_number._3_1_ = descriptor->field_0x3;
  bVar1 = DescriptorPool::ResolvesFeaturesForImpl
                    (*(DescriptorPool **)(this + 0x18),extension_number);
  if (bVar1) {
    pb::JavaFeatures::JavaFeatures(__return_storage_ptr__,(Arena *)0x0,&JStack_b8);
  }
  else {
    EVar2 = FileDescriptor::edition((FileDescriptor *)this);
    data._M_str._0_4_ = EVar2;
    data._M_len = (size_t)
                  "CicYhAciA8o+ACodCAEQAhgCIAMoATACOAJAAco+CggBEAEYACABKAMKJxjnByIDyj4AKh0IAhABGAEgAigBMAE4AkAByj4KCAAQARgAIAEoAwonGOgHIhMIARABGAEgAigBMAHKPgQIABABKg04AkAByj4GGAAgASgDIOYHKOgH"
    ;
    data._M_str._4_4_ = 0;
    ParseAndGetEditionResolvedFeatureSet
              ((FeatureSet *)local_68,(InternalFeatureHelper *)0xac,data,in_R8D);
    number_00._0_1_ = descriptor->super_SymbolBase;
    number_00._1_1_ = descriptor->is_placeholder_;
    number_00._2_1_ = descriptor->finished_building_;
    number_00._3_1_ = descriptor->field_0x3;
    pJVar3 = (JavaFeatures *)
             ExtensionSet::GetMessage
                       ((ExtensionSet *)(local_68 + 0x10),number_00,(MessageLite *)descriptor->name_
                       );
    pb::JavaFeatures::JavaFeatures(&local_90,(Arena *)0x0,pJVar3);
    FeatureSet::~FeatureSet((FeatureSet *)local_68);
    pb::JavaFeatures::MergeImpl((MessageLite *)&local_90,(MessageLite *)&JStack_b8);
    pb::JavaFeatures::JavaFeatures(__return_storage_ptr__,(Arena *)0x0,&local_90);
    pb::JavaFeatures::~JavaFeatures(&local_90);
  }
  pb::JavaFeatures::~JavaFeatures(&JStack_b8);
  return __return_storage_ptr__;
}

Assistant:

static auto GetResolvedFeatureExtension(
      const DescriptorT& descriptor,
      const google::protobuf::internal::ExtensionIdentifier<
          FeatureSet, MessageTypeTraits<ExtType>, field_type, is_packed>&
          extension) {
    auto lang_features = GetFeatures(descriptor).GetExtension(extension);
    if (GetDescriptorPool(descriptor).ResolvesFeaturesFor(extension)) {
      return lang_features;
    }

    auto lang_features_ret =
        ParseAndGetEditionResolvedFeatureSet(
            ::pb::internal::GetFeatureSetDefaultsData<ExtType>(),
            GetEdition(descriptor))
            .GetExtension(extension);
    lang_features_ret.MergeFrom(lang_features);
    return lang_features_ret;
  }